

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void * c4::detail::aalloc_impl(size_t size,size_t alignment)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  size_t __alignment;
  void *mem;
  void *local_20;
  
  __alignment = alignment;
  if (alignment < 8) {
    __alignment = 8;
  }
  iVar3 = posix_memalign(&local_20,__alignment,size);
  if (iVar3 == 0) {
    if (((ulong)local_20 & alignment - 1) != 0) {
      aalloc_impl();
    }
  }
  else {
    if (iVar3 == 0x16) {
      if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        pcVar1 = (code *)swi(3);
        pvVar4 = (void *)(*pcVar1)();
        return pvVar4;
      }
      handle_error(0x25d9ba,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x43cb,alignment);
    }
    if (iVar3 == 0xc) {
      if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        pcVar1 = (code *)swi(3);
        pvVar4 = (void *)(*pcVar1)();
        return pvVar4;
      }
      handle_error(0x25da14,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x43d0,size,size);
    }
    local_20 = (void *)0x0;
  }
  return local_20;
}

Assistant:

void* aalloc_impl(size_t size, size_t alignment)
{
    void *mem;
#if defined(C4_WIN) || defined(C4_XBOX)
    mem = ::_aligned_malloc(size, alignment);
    C4_CHECK(mem != nullptr || size == 0);
#elif defined(C4_ARM)
    // https://stackoverflow.com/questions/53614538/undefined-reference-to-posix-memalign-in-arm-gcc
    // https://electronics.stackexchange.com/questions/467382/e2-studio-undefined-reference-to-posix-memalign/467753
    mem = memalign(alignment, size);
    C4_CHECK(mem != nullptr || size == 0);
#elif defined(C4_POSIX) || defined(C4_IOS) || defined(C4_MACOS)
    // NOTE: alignment needs to be sized in multiples of sizeof(void*)
    size_t amult = alignment;
    if(C4_UNLIKELY(alignment < sizeof(void*)))
    {
        amult = sizeof(void*);
    }
    int ret = ::posix_memalign(&mem, amult, size);
    if(C4_UNLIKELY(ret))
    {
        if(ret == EINVAL)
        {
            C4_ERROR("The alignment argument %zu was not a power of two, "
                     "or was not a multiple of sizeof(void*)", alignment);
        }
        else if(ret == ENOMEM)
        {
            C4_ERROR("There was insufficient memory to fulfill the "
                     "allocation request of %zu bytes (alignment=%lu)", size, size);
        }
        return nullptr;
    }
#else
    C4_NOT_IMPLEMENTED_MSG("need to implement an aligned allocation for this platform");
#endif
    C4_ASSERT_MSG((uintptr_t(mem) & (alignment-1)) == 0, "address %p is not aligned to %zu boundary", mem, alignment);
    return mem;
}